

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_state.cpp
# Opt level: O3

CcsProperty * __thiscall
ccs::SearchState::doSearch(SearchState *this,CcsContext *context,string *propertyName)

{
  uint uVar1;
  uint uVar2;
  Property *pPVar3;
  Property *pPVar4;
  CcsTracer *pCVar5;
  long lVar6;
  __normal_iterator<const_ccs::Property_**,_std::vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>_>
  _Var7;
  __normal_iterator<const_ccs::Property_**,_std::vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>_>
  _Var8;
  const_iterator cVar9;
  ulong uVar10;
  Property **ppPVar11;
  __normal_iterator<const_ccs::Property_**,_std::vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>_>
  __i;
  long lVar12;
  Property **ppPVar13;
  vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_> values;
  vector<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_> baseValues;
  allocator_type local_79;
  __normal_iterator<const_ccs::Property_**,_std::vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>_>
  local_78;
  __normal_iterator<const_ccs::Property_**,_std::vector<const_ccs::Property_*,_std::allocator<const_ccs::Property_*>_>_>
  local_70;
  long local_68;
  vector<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_> local_60;
  vector<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_> local_48;
  
  while (cVar9 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::PropertySetting>_>_>
                 ::find(&(this->properties)._M_t,propertyName),
        (_Rb_tree_header *)cVar9._M_node == &(this->properties)._M_t._M_impl.super__Rb_tree_header)
  {
    this = (this->parent).super___shared_ptr<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    if (this == (element_type *)0x0) {
      return (CcsProperty *)0x0;
    }
  }
  if (cVar9._M_node[3]._M_right == (_Base_ptr)0x1) {
    return *(CcsProperty **)(cVar9._M_node[3]._M_parent + 1);
  }
  std::vector<ccs::Property_const*,std::allocator<ccs::Property_const*>>::
  vector<std::_Rb_tree_const_iterator<ccs::Property_const*>,void>
            ((vector<ccs::Property_const*,std::allocator<ccs::Property_const*>> *)&local_78,
             cVar9._M_node[3]._M_parent,
             (_Rb_tree_const_iterator<const_ccs::Property_*>)&cVar9._M_node[2]._M_right,
             (allocator_type *)&local_60);
  _Var8._M_current = local_70._M_current;
  _Var7._M_current = local_78._M_current;
  if (local_78._M_current != local_70._M_current) {
    lVar12 = (long)local_70._M_current - (long)local_78._M_current;
    uVar10 = lVar12 >> 3;
    lVar6 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<ccs::Property_const**,std::vector<ccs::Property_const*,std::allocator<ccs::Property_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ccs::SearchState::doSearch(ccs::CcsContext_const&,std::__cxx11::string_const&)const::__0>>
              (local_78._M_current,local_70._M_current,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar12 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<ccs::Property_const**,std::vector<ccs::Property_const*,std::allocator<ccs::Property_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<ccs::SearchState::doSearch(ccs::CcsContext_const&,std::__cxx11::string_const&)const::__0>>
                (_Var7._M_current,_Var8._M_current);
    }
    else {
      ppPVar13 = _Var7._M_current + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<ccs::Property_const**,std::vector<ccs::Property_const*,std::allocator<ccs::Property_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<ccs::SearchState::doSearch(ccs::CcsContext_const&,std::__cxx11::string_const&)const::__0>>
                (_Var7._M_current,ppPVar13);
      for (; ppPVar13 != _Var8._M_current; ppPVar13 = ppPVar13 + 1) {
        pPVar3 = ppPVar13[-1];
        pPVar4 = *ppPVar13;
        uVar1 = pPVar4->propertyNumber_;
        uVar2 = pPVar3->propertyNumber_;
        ppPVar11 = ppPVar13;
        while (uVar1 < uVar2) {
          *ppPVar11 = pPVar3;
          pPVar3 = ppPVar11[-2];
          ppPVar11 = ppPVar11 + -1;
          uVar2 = pPVar3->propertyNumber_;
        }
        *ppPVar11 = pPVar4;
      }
    }
  }
  std::vector<ccs::CcsProperty_const*,std::allocator<ccs::CcsProperty_const*>>::
  vector<__gnu_cxx::__normal_iterator<ccs::Property_const**,std::vector<ccs::Property_const*,std::allocator<ccs::Property_const*>>>,void>
            ((vector<ccs::CcsProperty_const*,std::allocator<ccs::CcsProperty_const*>> *)&local_60,
             local_78,local_70,&local_79);
  pCVar5 = this->tracer;
  std::vector<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_>::vector
            (&local_48,&local_60);
  (*pCVar5->_vptr_CcsTracer[4])(pCVar5,context,propertyName,&local_48);
  if (local_48.
      super__Vector_base<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pPVar3 = local_70._M_current[-1];
  if (local_60.
      super__Vector_base<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<const_ccs::CcsProperty_*,_std::allocator<const_ccs::CcsProperty_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78._M_current == (Property **)0x0) {
    return &pPVar3->super_CcsProperty;
  }
  operator_delete(local_78._M_current,local_68 - (long)local_78._M_current);
  return &pPVar3->super_CcsProperty;
}

Assistant:

const CcsProperty *SearchState::doSearch(const CcsContext &context,
    const std::string &propertyName) const {
  auto it = properties.find(propertyName);
  if (it == properties.end()) {
    if (parent) return parent->doSearch(context, propertyName);
    return nullptr;
  }

  if (it->second.values.size() == 1)
    return *it->second.values.begin();

  // it->second.values.size() > 1
  std::vector<const Property *> values(it->second.values.begin(),
      it->second.values.end());
  std::sort(values.begin(), values.end(),
      [](const Property *l, const Property *r) {
    return l->propertyNumber() < r->propertyNumber();
  });

  std::vector<const CcsProperty *> baseValues(values.begin(), values.end());
  tracer.onConflict(context, propertyName, baseValues);
  return values.back();
}